

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

InterpretResult __thiscall VM::run(VM *this)

{
  char cVar1;
  value_type vVar2;
  Instructions *pIVar3;
  bool bVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  byte bVar7;
  int iVar8;
  char *format;
  reference pvVar9;
  mapped_type *pmVar10;
  int iVar11;
  string local_2c8;
  mapped_type *local_2a8;
  mapped_type *fromTape;
  mapped_type *pmStack_298;
  value_type fromIdx;
  mapped_type *tape_7;
  string *local_270;
  string *name_9;
  mapped_type *tape_6;
  string *local_240;
  string *name_8;
  mapped_type *tape_5;
  string *local_210;
  string *name_7;
  mapped_type *tape_4;
  string *local_1e0;
  string *name_6;
  mapped_type *tape_3;
  string *local_1b0;
  string *name_5;
  undefined1 local_1a0 [6];
  uint16_t offset_1;
  string local_180;
  key_type *local_160;
  string *name_4;
  string local_138;
  key_type *local_118;
  string *name_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string error;
  mapped_type *tape_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  string *name_2;
  mapped_type *tape_1;
  string *local_70;
  string *name_1;
  uint16_t offset;
  mapped_type *local_58;
  mapped_type *tape;
  string *local_30;
  string *name;
  anon_class_8_1_8991fb9c aStack_20;
  OpCode instruction;
  anon_class_8_1_8991fb9c readByte;
  VM *this_local;
  
  aStack_20.this = this;
  readByte.this = this;
switchD_0010ee8f_default:
  do {
    bVar4 = Instructions::hasCodeAt(this->instructions,this->ip);
    if (!bVar4) {
      return OK;
    }
    name._7_1_ = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
    switch(name._7_1_) {
    case '\0':
      pIVar3 = this->instructions;
      bVar7 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      Instructions::getNameAt_abi_cxx11_((string *)&tape_4,pIVar3,(uint)bVar7);
      local_1e0 = (string *)&tape_4;
      name_7 = (string *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
               ::at(&this->tapes,(string *)&tape_4);
      *(long *)((long)&name_7->field_2 + 8) = *(long *)((long)&name_7->field_2 + 8) + 1;
      name_3._4_4_ = 4;
      std::__cxx11::string::~string((string *)&tape_4);
      goto switchD_0010ee8f_default;
    case '\x01':
      pIVar3 = this->instructions;
      bVar7 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      Instructions::getNameAt_abi_cxx11_((string *)&tape_2,pIVar3,(uint)bVar7);
      local_a0 = (string *)&tape_2;
      error.field_2._8_8_ =
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
           ::at(&this->tapes,(string *)&tape_2);
      if (((mapped_type *)error.field_2._8_8_)->ptr == 0) {
        std::operator+(&local_108,"Attempting to decrement the pointer below 0 on ",local_a0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,&local_108,".");
        std::__cxx11::string::~string((string *)&local_108);
        format = (char *)std::__cxx11::string::c_str();
        runtimeError(this,format);
        this_local._4_4_ = RUNTIME_ERROR;
        name_3._4_4_ = 1;
        std::__cxx11::string::~string((string *)local_e8);
      }
      else {
        ((mapped_type *)error.field_2._8_8_)->ptr = ((mapped_type *)error.field_2._8_8_)->ptr - 1;
        name_3._4_4_ = 4;
      }
      std::__cxx11::string::~string((string *)&tape_2);
      break;
    case '\x02':
      pIVar3 = this->instructions;
      bVar7 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      Instructions::getNameAt_abi_cxx11_((string *)&tape_3,pIVar3,(uint)bVar7);
      local_1b0 = (string *)&tape_3;
      name_6 = (string *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
               ::at(&this->tapes,(string *)&tape_3);
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)name_6,
                          *(size_type *)((long)&name_6->field_2 + 8));
      cVar1 = *pvVar9;
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)name_6,
                          *(size_type *)((long)&name_6->field_2 + 8));
      *pvVar9 = cVar1 + '\x01';
      name_3._4_4_ = 4;
      std::__cxx11::string::~string((string *)&tape_3);
      goto switchD_0010ee8f_default;
    case '\x03':
      pIVar3 = this->instructions;
      bVar7 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      Instructions::getNameAt_abi_cxx11_((string *)&tape_1,pIVar3,(uint)bVar7);
      local_70 = (string *)&tape_1;
      name_2 = (string *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
               ::at(&this->tapes,(string *)&tape_1);
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)name_2,
                          *(size_type *)((long)&name_2->field_2 + 8));
      cVar1 = *pvVar9;
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)name_2,
                          *(size_type *)((long)&name_2->field_2 + 8));
      *pvVar9 = cVar1 + -1;
      std::__cxx11::string::~string((string *)&tape_1);
      goto switchD_0010ee8f_default;
    case '\x04':
      pIVar3 = this->instructions;
      bVar7 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      Instructions::getNameAt_abi_cxx11_((string *)&tape_6,pIVar3,(uint)bVar7);
      local_240 = (string *)&tape_6;
      name_9 = (string *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
               ::at(&this->tapes,(string *)&tape_6);
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)name_9,
                          *(size_type *)((long)&name_9->field_2 + 8));
      std::operator<<((ostream *)&std::cout,*pvVar9);
      name_3._4_4_ = 4;
      std::__cxx11::string::~string((string *)&tape_6);
      goto switchD_0010ee8f_default;
    case '\x05':
      pIVar3 = this->instructions;
      bVar7 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      Instructions::getNameAt_abi_cxx11_((string *)&tape_5,pIVar3,(uint)bVar7);
      local_210 = (string *)&tape_5;
      name_8 = (string *)
               std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
               ::at(&this->tapes,(string *)&tape_5);
      iVar8 = getchar();
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)name_8,
                          *(size_type *)((long)&name_8->field_2 + 8));
      *pvVar9 = (value_type)iVar8;
      name_3._4_4_ = 4;
      std::__cxx11::string::~string((string *)&tape_5);
      goto switchD_0010ee8f_default;
    case '\x06':
      pIVar3 = this->instructions;
      bVar7 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      Instructions::getNameAt_abi_cxx11_((string *)&tape,pIVar3,(uint)bVar7);
      local_30 = (string *)&tape;
      local_58 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
                 ::at(&this->tapes,(string *)&tape);
      uVar5 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      uVar6 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      name_1._2_2_ = CONCAT11(uVar5,uVar6);
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[](&local_58->values,local_58->ptr)
      ;
      if (*pvVar9 == '\0') {
        this->ip = (uint)name_1._2_2_ + this->ip;
      }
      std::__cxx11::string::~string((string *)&tape);
      goto switchD_0010ee8f_default;
    case '\a':
      run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      uVar5 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      uVar6 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      name_5._6_2_ = CONCAT11(uVar5,uVar6);
      this->ip = this->ip - (uint)name_5._6_2_;
      goto switchD_0010ee8f_default;
    case '\b':
      pIVar3 = this->instructions;
      bVar7 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      Instructions::getNameAt_abi_cxx11_(&local_138,pIVar3,(uint)bVar7);
      local_118 = &local_138;
      Tape::Tape((Tape *)&name_4);
      pmVar10 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
                ::operator[](&this->tapes,local_118);
      Tape::operator=(pmVar10,(Tape *)&name_4);
      Tape::~Tape((Tape *)&name_4);
      name_3._4_4_ = 4;
      std::__cxx11::string::~string((string *)&local_138);
      goto switchD_0010ee8f_default;
    case '\t':
      pIVar3 = this->instructions;
      bVar7 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      Instructions::getNameAt_abi_cxx11_(&local_180,pIVar3,(uint)bVar7);
      local_160 = &local_180;
      Tape::Tape((Tape *)local_1a0);
      pmVar10 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
                ::operator[](&this->tapes,local_160);
      Tape::operator=(pmVar10,(Tape *)local_1a0);
      Tape::~Tape((Tape *)local_1a0);
      name_3._4_4_ = 4;
      std::__cxx11::string::~string((string *)&local_180);
      goto switchD_0010ee8f_default;
    case '\n':
      pIVar3 = this->instructions;
      bVar7 = run::anon_class_8_1_8991fb9c::operator()(&stack0xffffffffffffffe0);
      Instructions::getNameAt_abi_cxx11_((string *)&tape_7,pIVar3,(uint)bVar7);
      local_270 = (string *)&tape_7;
      pmStack_298 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
                    ::at(&this->tapes,(string *)&tape_7);
      pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                         (&pmStack_298->values,pmStack_298->ptr);
      fromTape._7_1_ = *pvVar9;
      iVar11 = (int)fromTape._7_1_;
      iVar8 = Instructions::tapeCount(this->instructions);
      if (iVar11 < iVar8) {
        Instructions::getNameAt_abi_cxx11_(&local_2c8,this->instructions,(int)fromTape._7_1_);
        pmVar10 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
                  ::at(&this->tapes,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        local_2a8 = pmVar10;
        pvVar9 = std::vector<char,_std::allocator<char>_>::operator[](&pmVar10->values,pmVar10->ptr)
        ;
        vVar2 = *pvVar9;
        pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                           (&pmStack_298->values,pmStack_298->ptr);
        *pvVar9 = vVar2;
        name_3._4_4_ = 4;
      }
      else {
        runtimeError(this,"Attempting to copy a value from a tape that does not exist.");
        this_local._4_4_ = RUNTIME_ERROR;
        name_3._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)&tape_7);
      break;
    default:
      goto switchD_0010ee8f_default;
    }
    if (name_3._4_4_ == 1) {
      return this_local._4_4_;
    }
  } while( true );
}

Assistant:

InterpretResult VM::run()
{
    auto readByte = [this]() -> uint8_t
    {
        return this->instructions.getCodeAt(this->ip++);
    };

    while (instructions.hasCodeAt(ip))
    {
#ifdef DEBUG_TRACE_EXECUTION
        instructions.disassembleInstruction(ip);
#endif

        auto instruction = OpCode(readByte());
        switch (instruction)
        {
            case OpCode::BEGIN:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                
                uint16_t offset = (readByte() << 8) | readByte();
                if (tape.values[tape.ptr] == 0) ip += offset;

                break;
            }
            case OpCode::DECATPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = tape.values[tape.ptr] - 1;

                break;
            }
            case OpCode::DECPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                if (tape.ptr == 0)
                {
                    std::string error = "Attempting to decrement the pointer below 0 on " + name + ".";
                    runtimeError(error.c_str());
                    return InterpretResult::RUNTIME_ERROR;
                }
                else
                {
                    tape.ptr--;
                }
                break;
            }
            case OpCode::DEFINE_NAME:
            {
                const auto& name = instructions.getNameAt(readByte());
                tapes[name] = Tape();
                break;
            }
            case OpCode::DELETE_NAME:
            {
                // Should actually erase the tape or something here.
                const auto& name = instructions.getNameAt(readByte());
                tapes[name] = Tape();
                break;
            }
            case OpCode::END:
            {
                readByte(); // Tape name, not required here.
                uint16_t offset = (readByte() << 8) | readByte();
                ip -= offset;
                break;
            }
            case OpCode::INCATPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = tape.values[tape.ptr] + 1;

                break;
            }
            case OpCode::INCPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.ptr++;
                break;
            }
            case OpCode::INPUT:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = getchar();
                break;
            }
            case OpCode::OUTPUT:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                std::cout << tape.values[tape.ptr];
                break;
            }
            case OpCode::COPY_FROM:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                auto fromIdx = tape.values[tape.ptr];
                if (fromIdx >= instructions.tapeCount())
                {
                    runtimeError("Attempting to copy a value from a tape that does not exist.");
                    return InterpretResult::RUNTIME_ERROR;
                }
                else
                {
                    auto& fromTape = tapes.at(instructions.getNameAt(fromIdx));
                    tape.values[tape.ptr] = fromTape.values[fromTape.ptr];
                }
                break;
            }
        }
    }
    return InterpretResult::OK;
}